

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

LocVar * localdebuginfo(FuncState *fs,int vidx)

{
  Vardesc *pVVar1;
  long lVar2;
  
  pVVar1 = (fs->ls->dyd->actvar).arr;
  lVar2 = (long)vidx + (long)fs->firstlocal;
  if (*(char *)((long)pVVar1 + lVar2 * 0x18 + 9) == '\x03') {
    return (LocVar *)0x0;
  }
  return fs->f->locvars + (&pVVar1->vd)[lVar2].pidx;
}

Assistant:

static LocVar *localdebuginfo (FuncState *fs, int vidx) {
  Vardesc *vd = getlocalvardesc(fs,  vidx);
  if (vd->vd.kind == RDKCTC)
    return NULL;  /* no debug info. for constants */
  else {
    int idx = vd->vd.pidx;
    lua_assert(idx < fs->ndebugvars);
    return &fs->f->locvars[idx];
  }
}